

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

EqualsMatcher *
Catch::Matchers::Equals(EqualsMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  CasedString local_38;
  
  local_38.m_caseSensitivity = caseSensitivity;
  StdString::CasedString::adjustString(&local_38.m_str,&local_38,str);
  StdString::EqualsMatcher::EqualsMatcher(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_str._M_dataplus._M_p != &local_38.m_str.field_2) {
    operator_delete(local_38.m_str._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

StdString::EqualsMatcher Equals( std::string const& str, CaseSensitive::Choice caseSensitivity ) {
        return StdString::EqualsMatcher( StdString::CasedString( str, caseSensitivity) );
    }